

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
deleteContents(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
               *this)

{
  Entry *pEVar1;
  long *plVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  _Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  local_30;
  
  lVar3 = 8;
  for (uVar4 = 0; pEVar1 = this->_entries, uVar4 < this->_numEntries; uVar4 = uVar4 + 1) {
    if ((*(long *)((long)&(pEVar1->key)._val + lVar3) != 0) &&
       (plVar2 = *(long **)((long)&(this->_entries->key)._val + lVar3), plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 8))();
    }
    lVar3 = lVar3 + 0x10;
  }
  if (pEVar1 != (Entry *)0x0) {
    operator_delete__(pEVar1);
  }
  uVar4 = 0;
  while( true ) {
    local_30._M_impl.super__Vector_impl_data._M_start =
         (this->_oldEntries).
         super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_30._M_impl.super__Vector_impl_data._M_finish =
         (this->_oldEntries).
         super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)local_30._M_impl.super__Vector_impl_data._M_finish -
                (long)local_30._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    if (local_30._M_impl.super__Vector_impl_data._M_start[uVar4] != (Entry *)0x0) {
      operator_delete__(local_30._M_impl.super__Vector_impl_data._M_start[uVar4]);
    }
    uVar4 = uVar4 + 1;
  }
  local_30._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_oldEntries).
       super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ::~_Vector_base(&local_30);
  return;
}

Assistant:

void deleteContents()
    {
        for (uint32_t i = 0; i < _numEntries; ++i) {
            if (_entries[i].value) delete _entries[i].value;
        }
        delete [] _entries;
        for (size_t i = 0; i < _oldEntries.size(); ++i) {
            delete [] _oldEntries[i];
        }
        std::vector<Entry*>().swap(_oldEntries);
    }